

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O2

int coda_cursor_read_uint64_partial_array
              (coda_cursor_conflict *cursor,long offset,long length,uint64_t *dst)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *message;
  coda_type *type;
  long in_FS_OFFSET;
  long num_elements;
  coda_native_type read_type;
  
  if (((cursor == (coda_cursor_conflict *)0x0) || (cursor->n < 1)) ||
     (type = (coda_type *)cursor->stack[cursor->n - 1].type, type == (coda_type *)0x0)) {
    pcVar2 = "invalid cursor argument (%s:%u)";
    uVar3 = 0x1372;
  }
  else {
    if (dst != (uint64_t *)0x0) {
      if (99 < type->format) {
        type = *(coda_type **)&type->type_class;
      }
      if (type->type_class == coda_array_class) {
        if (*(int *)(in_FS_OFFSET + -0x1208) != 0) {
          iVar1 = coda_cursor_get_num_elements(cursor,&num_elements);
          if (iVar1 != 0) {
            return -1;
          }
          if (offset < 0 || num_elements <= offset) {
            coda_set_error(-0x6b,"array offset (%ld) exceeds array range [0:%ld)",offset,
                           num_elements);
            return -1;
          }
          if (num_elements < length + offset) {
            coda_set_error(-0x6b,"array offset (%ld) + length (%ld) exceeds array range [0:%ld)",
                           offset,length);
            return -1;
          }
        }
        get_array_element_read_type(type,&read_type);
        switch(read_type) {
        case coda_native_type_uint8:
          iVar1 = read_uint8_partial_array(cursor,offset,length,(uint8_t *)dst);
          if (iVar1 != 0) {
            return -1;
          }
          for (; 0 < length; length = length + -1) {
            dst[length + -1] = (ulong)*(byte *)((long)dst + length + -1);
          }
          return 0;
        default:
          pcVar2 = coda_type_get_native_type_name(read_type);
          message = "can not read %s data using a uint64 data type";
          break;
        case coda_native_type_uint16:
          iVar1 = read_uint16_partial_array(cursor,offset,length,(uint16_t *)dst);
          if (iVar1 != 0) {
            return -1;
          }
          for (; 0 < length; length = length + -1) {
            dst[length + -1] = (ulong)*(ushort *)((long)dst + length * 2 + -2);
          }
          return 0;
        case coda_native_type_uint32:
          iVar1 = read_uint32_partial_array(cursor,offset,length,(uint32_t *)dst);
          if (iVar1 != 0) {
            return -1;
          }
          for (; 0 < length; length = length + -1) {
            dst[length + -1] = (ulong)*(uint *)((long)dst + length * 4 + -4);
          }
          return 0;
        case coda_native_type_uint64:
          iVar1 = read_uint64_partial_array(cursor,offset,length,dst);
          if (iVar1 != 0) {
            return -1;
          }
          return 0;
        }
      }
      else {
        pcVar2 = coda_type_get_class_name(type->type_class);
        message = "cursor does not refer to an array (current type is %s)";
      }
      coda_set_error(-0x69,message,pcVar2);
      return -1;
    }
    pcVar2 = "dst argument is NULL (%s:%u)";
    uVar3 = 0x1377;
  }
  coda_set_error(-100,pcVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                 ,uVar3);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_read_uint64_partial_array(const coda_cursor *cursor, long offset, long length,
                                                      uint64_t *dst)
{
    coda_native_type read_type;
    coda_type *type;
    long i;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    /* check the range for offset and length */
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;

        if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
        {
            return -1;
        }
        if (offset < 0 || offset >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) exceeds array range [0:%ld)", offset,
                           num_elements);
            return -1;
        }
        if (offset + length > num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) + length (%ld) exceeds array range "
                           "[0:%ld)", offset, length, num_elements);
            return -1;
        }
    }

    if (get_array_element_read_type(type, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_uint8:
            if (read_uint8_partial_array(cursor, offset, length, (uint8_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (uint64_t)((uint8_t *)dst)[i];
            }
            break;
        case coda_native_type_uint16:
            if (read_uint16_partial_array(cursor, offset, length, (uint16_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (uint64_t)((uint16_t *)dst)[i];
            }
            break;
        case coda_native_type_uint32:
            if (read_uint32_partial_array(cursor, offset, length, (uint32_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (uint64_t)((uint32_t *)dst)[i];
            }
            break;
        case coda_native_type_uint64:
            if (read_uint64_partial_array(cursor, offset, length, dst) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a uint64 data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}